

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmLocalNinjaGenerator::Generate(cmLocalNinjaGenerator *this)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  string *remote_path;
  cmGeneratedFileStream *pcVar4;
  cmMakefile *this_01;
  ulong uVar5;
  ostream *poVar6;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *this_02;
  reference ppcVar7;
  cmNinjaTargetGenerator *pcVar8;
  cmGlobalNinjaGenerator *pcVar9;
  cmNinjaTargetGenerator *tg;
  cmGeneratorTarget *target;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range1;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *targets;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  string local_50 [8];
  string showIncludesPrefix;
  cmLocalNinjaGenerator *this_local;
  
  psVar3 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  remote_path = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmLocalGenerator::MaybeConvertToRelativePath
            ((string *)((long)&showIncludesPrefix.field_2 + 8),(cmLocalGenerator *)this,psVar3,
             remote_path);
  std::__cxx11::string::operator=
            ((string *)&this->HomeRelativeOutputPath,
             (string *)(showIncludesPrefix.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(showIncludesPrefix.field_2._M_local_buf + 8));
  bVar1 = std::operator==(&this->HomeRelativeOutputPath,".");
  if (bVar1) {
    std::__cxx11::string::clear();
  }
  pcVar4 = GetBuildFileStream(this);
  WriteProcessedMakefile(this,(ostream *)pcVar4);
  bVar1 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
  if (bVar1) {
    WriteBuildFileTop(this);
    pcVar4 = GetRulesFileStream(this);
    WritePools(this,(ostream *)pcVar4);
    this_01 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"CMAKE_CL_SHOWINCLUDES_PREFIX",&local_71);
    psVar3 = cmMakefile::GetSafeDefinition(this_01,&local_70);
    std::__cxx11::string::string(local_50,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar4 = GetRulesFileStream(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"localized /showIncludes string",
                 (allocator<char> *)((long)&targets + 7));
      cmGlobalNinjaGenerator::WriteComment((ostream *)pcVar4,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&targets + 7));
      pcVar4 = GetRulesFileStream(this);
      poVar6 = std::operator<<((ostream *)pcVar4,"msvc_deps_prefix = ");
      poVar6 = std::operator<<(poVar6,local_50);
      std::operator<<(poVar6,"\n\n");
    }
    std::__cxx11::string::~string(local_50);
  }
  this_02 = cmLocalGenerator::GetGeneratorTargets((cmLocalGenerator *)this);
  __end1 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(this_02);
  target = (cmGeneratorTarget *)
           std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(this_02);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                     *)&target), bVar1) {
    ppcVar7 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppcVar7;
    TVar2 = cmGeneratorTarget::GetType(this_00);
    if ((TVar2 != INTERFACE_LIBRARY) &&
       (pcVar8 = cmNinjaTargetGenerator::New(this_00), pcVar8 != (cmNinjaTargetGenerator *)0x0)) {
      (*(pcVar8->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[3])();
      pcVar9 = GetGlobalNinjaGenerator(this);
      bVar1 = cmGlobalNinjaGenerator::IsExcluded(pcVar9,this_00);
      if (!bVar1) {
        pcVar9 = GetGlobalNinjaGenerator(this);
        cmGlobalNinjaGenerator::AddDependencyToAll(pcVar9,this_00);
      }
      if (pcVar8 != (cmNinjaTargetGenerator *)0x0) {
        (*(pcVar8->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[1])();
      }
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&__end1);
  }
  WriteCustomCommandBuildStatements(this);
  return;
}

Assistant:

void cmLocalNinjaGenerator::Generate()
{
  // Compute the path to use when referencing the current output
  // directory from the top output directory.
  this->HomeRelativeOutputPath = this->MaybeConvertToRelativePath(
    this->GetBinaryDirectory(), this->GetCurrentBinaryDirectory());
  if (this->HomeRelativeOutputPath == ".") {
    this->HomeRelativeOutputPath.clear();
  }

  this->WriteProcessedMakefile(this->GetBuildFileStream());
#ifdef NINJA_GEN_VERBOSE_FILES
  this->WriteProcessedMakefile(this->GetRulesFileStream());
#endif

  // We do that only once for the top CMakeLists.txt file.
  if (this->IsRootMakefile()) {
    this->WriteBuildFileTop();

    this->WritePools(this->GetRulesFileStream());

    const std::string showIncludesPrefix =
      this->GetMakefile()->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
    if (!showIncludesPrefix.empty()) {
      cmGlobalNinjaGenerator::WriteComment(this->GetRulesFileStream(),
                                           "localized /showIncludes string");
      this->GetRulesFileStream()
        << "msvc_deps_prefix = " << showIncludesPrefix << "\n\n";
    }
  }

  const std::vector<cmGeneratorTarget*>& targets = this->GetGeneratorTargets();
  for (cmGeneratorTarget* target : targets) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    cmNinjaTargetGenerator* tg = cmNinjaTargetGenerator::New(target);
    if (tg) {
      tg->Generate();
      // Add the target to "all" if required.
      if (!this->GetGlobalNinjaGenerator()->IsExcluded(target)) {
        this->GetGlobalNinjaGenerator()->AddDependencyToAll(target);
      }
      delete tg;
    }
  }

  this->WriteCustomCommandBuildStatements();
}